

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::ReferenceContext
          (ReferenceContext *this,ReferenceContextLimits *limits,
          MultisamplePixelBufferAccess *colorbuffer,MultisamplePixelBufferAccess *depthbuffer,
          MultisamplePixelBufferAccess *stencilbuffer)

{
  _Rb_tree_header *p_Var1;
  Texture1D *this_00;
  Texture2D *this_01;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  int faceNdx;
  int z;
  PixelBufferAccess *this_02;
  anon_union_16_3_1194ccdc_for_v local_98;
  allocator_type local_81;
  TextureCube *local_80;
  TextureCubeArray *local_78;
  Texture3D *local_70;
  Texture2DArray *local_68;
  vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *local_60;
  Texture2D *local_58;
  Texture1D *local_50;
  vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
  *local_48;
  VertexArray *local_40;
  ReferenceContextLimits *local_38;
  
  (this->super_Context).m_type.super_ApiType.m_bits = (limits->contextType).super_ApiType.m_bits;
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__ReferenceContext_01e70828;
  local_38 = &this->m_limits;
  ReferenceContextLimits::ReferenceContextLimits(local_38,limits);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&this->m_defaultColorbuffer,
             (ConstPixelBufferAccess *)colorbuffer);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&this->m_defaultDepthbuffer,
             (ConstPixelBufferAccess *)depthbuffer);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&this->m_defaultStencilbuffer,
             (ConstPixelBufferAccess *)stencilbuffer);
  local_40 = &this->m_clientVertexArray;
  rc::VertexArray::VertexArray(local_40,0,(this->m_limits).maxVertexAttribs);
  uVar3 = *(undefined8 *)((colorbuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data + 1);
  (this->m_viewport).m_data[0] = 0;
  (this->m_viewport).m_data[1] = 0;
  *(undefined8 *)((this->m_viewport).m_data + 2) = uVar3;
  (this->m_textures).m_lastName = 0;
  p_Var1 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
  (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_framebuffers).m_lastName = 0;
  p_Var1 = &(this->m_framebuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
  (this->m_framebuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_framebuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_framebuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_framebuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_framebuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_renderbuffers).m_lastName = 0;
  p_Var1 = &(this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
  (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_buffers).m_lastName = 0;
  p_Var1 = &(this->m_buffers).m_objects._M_t._M_impl.super__Rb_tree_header;
  (this->m_buffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_buffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_buffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_buffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_buffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_vertexArrays).m_lastName = 0;
  p_Var1 = &(this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header;
  (this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_programs).m_lastName = 0;
  p_Var1 = &(this->m_programs).m_objects._M_t._M_impl.super__Rb_tree_header;
  (this->m_programs).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_programs).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_programs).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_programs).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_programs).m_objects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_activeTexture = 0;
  std::
  vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
  ::vector(&this->m_textureUnits,(long)(this->m_limits).maxTextureImageUnits,
           (allocator_type *)&local_98);
  this_00 = &this->m_emptyTex1D;
  local_48 = &this->m_textureUnits;
  rc::Texture1D::Texture1D(this_00,0);
  this_01 = &this->m_emptyTex2D;
  local_50 = this_00;
  rc::Texture2D::Texture2D(this_01,0);
  local_80 = &this->m_emptyTexCube;
  local_58 = this_01;
  rc::TextureCube::TextureCube(local_80,0);
  local_68 = &this->m_emptyTex2DArray;
  rc::Texture2DArray::Texture2DArray(local_68,0);
  local_70 = &this->m_emptyTex3D;
  rc::Texture3D::Texture3D(local_70,0);
  local_78 = &this->m_emptyTexCubeArray;
  rc::TextureCubeArray::TextureCubeArray(local_78,0);
  this->m_pixelUnpackRowLength = 0;
  this->m_pixelUnpackSkipRows = 0;
  this->m_pixelUnpackSkipPixels = 0;
  this->m_pixelUnpackImageHeight = 0;
  this->m_pixelUnpackSkipImages = 0;
  this->m_pixelUnpackAlignment = 4;
  this->m_pixelPackAlignment = 4;
  this->m_readFramebufferBinding = (Framebuffer *)0x0;
  this->m_drawFramebufferBinding = (Framebuffer *)0x0;
  this->m_renderbufferBinding = (Renderbuffer *)0x0;
  this->m_vertexArrayBinding = (VertexArray *)0x0;
  this->m_currentProgram = (ShaderProgramObjectContainer *)0x0;
  this->m_arrayBufferBinding = (DataBuffer *)0x0;
  this->m_pixelPackBufferBinding = (DataBuffer *)0x0;
  this->m_pixelUnpackBufferBinding = (DataBuffer *)0x0;
  this->m_transformFeedbackBufferBinding = (DataBuffer *)0x0;
  this->m_uniformBufferBinding = (DataBuffer *)0x0;
  this->m_copyReadBufferBinding = (DataBuffer *)0x0;
  this->m_copyWriteBufferBinding = (DataBuffer *)0x0;
  this->m_drawIndirectBufferBinding = (DataBuffer *)0x0;
  (this->m_clearColor).m_data[0] = 0.0;
  (this->m_clearColor).m_data[1] = 0.0;
  (this->m_clearColor).m_data[2] = 0.0;
  (this->m_clearColor).m_data[3] = 0.0;
  this->m_clearDepth = 1.0;
  this->m_clearStencil = 0;
  lVar4 = 0;
  this->m_scissorEnabled = false;
  tcu::Vector<int,_4>::Vector(&this->m_scissorBox,&this->m_viewport);
  this->m_stencilTestEnabled = false;
  do {
    puVar2 = (undefined8 *)((long)&this->m_stencil[0].func + lVar4);
    *puVar2 = 0x207;
    puVar2[1] = 0x1e00ffffffff;
    *(undefined8 *)((long)&this->m_stencil[0].opDepthFail + lVar4) = 0x1e0000001e00;
    *(undefined4 *)((long)&this->m_stencil[0].writeMask + lVar4) = 0xffffffff;
    lVar4 = lVar4 + 0x1c;
  } while (lVar4 != 0x38);
  this->m_depthTestEnabled = false;
  this->m_depthFunc = 0x201;
  this->m_depthRangeNear = 0.0;
  this->m_depthRangeFar = 1.0;
  this->m_polygonOffsetFactor = 0.0;
  this->m_polygonOffsetUnits = 0.0;
  *(undefined4 *)((long)&this->m_polygonOffsetUnits + 3) = 0;
  this->m_blendModeRGB = 0x8006;
  this->m_blendModeAlpha = 0x8006;
  this->m_blendFactorSrcRGB = 1;
  this->m_blendFactorDstRGB = 0;
  this->m_blendFactorSrcAlpha = 1;
  this->m_blendFactorDstAlpha = 0;
  (this->m_blendColor).m_data[0] = 0.0;
  (this->m_blendColor).m_data[1] = 0.0;
  (this->m_blendColor).m_data[2] = 0.0;
  (this->m_blendColor).m_data[3] = 0.0;
  this->m_sRGBUpdateEnabled = true;
  this->m_depthClampEnabled = false;
  *(undefined4 *)(this->m_colorMask).m_data = 0x1010101;
  this->m_depthMask = true;
  local_98._0_8_ = 0;
  local_98._8_8_ = 0x3f80000000000000;
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            (&this->m_currentAttribs,(long)(this->m_limits).maxVertexAttribs,(value_type *)&local_98
             ,&local_81);
  this->m_lineWidth = 1.0;
  this->m_primitiveRestartFixedIndex = false;
  this->m_primitiveRestartSettableIndex = false;
  this->m_primitiveRestartIndex = 0;
  this->m_lastError = 0;
  local_60 = &this->m_currentAttribs;
  rr::FragmentProcessor::FragmentProcessor(&this->m_fragmentProcessor);
  (this->m_emptyTex1D).super_Texture.m_sampler.wrapS = CLAMP_TO_EDGE;
  (this->m_emptyTex1D).super_Texture.m_sampler.wrapT = CLAMP_TO_EDGE;
  (this->m_emptyTex1D).super_Texture.m_sampler.minFilter = NEAREST;
  (this->m_emptyTex1D).super_Texture.m_sampler.magFilter = NEAREST;
  (this->m_fragmentBuffer).super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fragmentBuffer).super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fragmentBuffer).super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fragmentDepths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fragmentDepths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fragmentDepths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._0_8_ = 0x300000008;
  rc::Texture1D::allocLevel(this_00,0,(TextureFormat *)&local_98,1);
  local_98._0_8_ = 0;
  local_98._8_8_ = 0x3f80000000000000;
  tcu::PixelBufferAccess::setPixel((this->m_emptyTex1D).m_levels.m_access,(Vec4 *)&local_98,0,0,0);
  rc::Texture1D::updateView(this_00,MODE_LAST);
  (this->m_emptyTex2D).super_Texture.m_sampler.wrapS = CLAMP_TO_EDGE;
  (this->m_emptyTex2D).super_Texture.m_sampler.wrapT = CLAMP_TO_EDGE;
  (this->m_emptyTex2D).super_Texture.m_sampler.minFilter = NEAREST;
  (this->m_emptyTex2D).super_Texture.m_sampler.magFilter = NEAREST;
  local_98._0_8_ = 0x300000008;
  rc::Texture2D::allocLevel(this_01,0,(TextureFormat *)&local_98,1,1);
  local_98._0_8_ = 0;
  local_98._8_8_ = 0x3f80000000000000;
  tcu::PixelBufferAccess::setPixel((this->m_emptyTex2D).m_levels.m_access,(Vec4 *)&local_98,0,0,0);
  rc::Texture2D::updateView(this_01,MODE_LAST);
  (this->m_emptyTexCube).super_Texture.m_sampler.wrapS = CLAMP_TO_EDGE;
  (this->m_emptyTexCube).super_Texture.m_sampler.wrapT = CLAMP_TO_EDGE;
  (this->m_emptyTexCube).super_Texture.m_sampler.minFilter = NEAREST;
  (this->m_emptyTexCube).super_Texture.m_sampler.magFilter = NEAREST;
  this_02 = (this->m_emptyTexCube).m_levels[0].m_access;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    local_98._0_8_ = 0x300000008;
    rc::TextureCube::allocFace(local_80,0,(CubeFace)lVar4,(TextureFormat *)&local_98,1,1);
    local_98._0_8_ = 0;
    local_98._8_8_ = 0x3f80000000000000;
    tcu::PixelBufferAccess::setPixel(this_02,(Vec4 *)&local_98,0,0,0);
    this_02 = (PixelBufferAccess *)((long)(this_02 + 0x21) + 0x18);
  }
  rc::TextureCube::updateView(local_80,MODE_LAST);
  (this->m_emptyTex2DArray).super_Texture.m_sampler.wrapS = CLAMP_TO_EDGE;
  (this->m_emptyTex2DArray).super_Texture.m_sampler.wrapT = CLAMP_TO_EDGE;
  (this->m_emptyTex2DArray).super_Texture.m_sampler.minFilter = NEAREST;
  (this->m_emptyTex2DArray).super_Texture.m_sampler.magFilter = NEAREST;
  local_98._0_8_ = 0x300000008;
  rc::TextureLevelArray::allocLevel
            (&(this->m_emptyTex2DArray).m_levels,0,(TextureFormat *)&local_98,1,1,1);
  local_98._0_8_ = 0;
  local_98._8_8_ = 0x3f80000000000000;
  tcu::PixelBufferAccess::setPixel
            ((this->m_emptyTex2DArray).m_levels.m_access,(Vec4 *)&local_98,0,0,0);
  rc::Texture2DArray::updateView(local_68,MODE_LAST);
  (this->m_emptyTex3D).super_Texture.m_sampler.magFilter = NEAREST;
  (this->m_emptyTex3D).super_Texture.m_sampler.wrapS = CLAMP_TO_EDGE;
  (this->m_emptyTex3D).super_Texture.m_sampler.wrapT = CLAMP_TO_EDGE;
  (this->m_emptyTex3D).super_Texture.m_sampler.wrapR = CLAMP_TO_EDGE;
  (this->m_emptyTex3D).super_Texture.m_sampler.minFilter = NEAREST;
  local_98._0_8_ = 0x300000008;
  rc::TextureLevelArray::allocLevel
            (&(this->m_emptyTex3D).m_levels,0,(TextureFormat *)&local_98,1,1,1);
  local_98._0_8_ = 0;
  local_98._8_8_ = 0x3f80000000000000;
  tcu::PixelBufferAccess::setPixel((this->m_emptyTex3D).m_levels.m_access,(Vec4 *)&local_98,0,0,0);
  rc::Texture3D::updateView(local_70,MODE_LAST);
  (this->m_emptyTexCubeArray).super_Texture.m_sampler.wrapS = CLAMP_TO_EDGE;
  (this->m_emptyTexCubeArray).super_Texture.m_sampler.wrapT = CLAMP_TO_EDGE;
  (this->m_emptyTexCubeArray).super_Texture.m_sampler.minFilter = NEAREST;
  (this->m_emptyTexCubeArray).super_Texture.m_sampler.magFilter = NEAREST;
  local_98._0_8_ = 0x300000008;
  rc::TextureLevelArray::allocLevel
            (&(this->m_emptyTexCubeArray).m_levels,0,(TextureFormat *)&local_98,1,1,6);
  for (z = 0; z != 6; z = z + 1) {
    local_98._0_8_ = 0;
    local_98._8_8_ = 0x3f80000000000000;
    tcu::PixelBufferAccess::setPixel
              ((this->m_emptyTexCubeArray).m_levels.m_access,(Vec4 *)&local_98,0,0,z);
  }
  rc::TextureCubeArray::updateView(local_78,MODE_LAST);
  if (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0x100) {
    this->m_sRGBUpdateEnabled = false;
  }
  return;
}

Assistant:

ReferenceContext::ReferenceContext (const ReferenceContextLimits& limits, const rr::MultisamplePixelBufferAccess& colorbuffer, const rr::MultisamplePixelBufferAccess& depthbuffer, const rr::MultisamplePixelBufferAccess& stencilbuffer)
	: Context							(limits.contextType)
	, m_limits							(limits)
	, m_defaultColorbuffer				(colorbuffer)
	, m_defaultDepthbuffer				(depthbuffer)
	, m_defaultStencilbuffer			(stencilbuffer)
	, m_clientVertexArray				(0, m_limits.maxVertexAttribs)

	, m_viewport						(0, 0, colorbuffer.raw().getHeight(), colorbuffer.raw().getDepth())

	, m_activeTexture					(0)
	, m_textureUnits					(m_limits.maxTextureImageUnits)
	, m_emptyTex1D						()
	, m_emptyTex2D						()
	, m_emptyTexCube					()
	, m_emptyTex2DArray					()
	, m_emptyTex3D						()
	, m_emptyTexCubeArray				()

	, m_pixelUnpackRowLength			(0)
	, m_pixelUnpackSkipRows				(0)
	, m_pixelUnpackSkipPixels			(0)
	, m_pixelUnpackImageHeight			(0)
	, m_pixelUnpackSkipImages			(0)
	, m_pixelUnpackAlignment			(4)
	, m_pixelPackAlignment				(4)

	, m_readFramebufferBinding			(DE_NULL)
	, m_drawFramebufferBinding			(DE_NULL)
	, m_renderbufferBinding				(DE_NULL)
	, m_vertexArrayBinding				(DE_NULL)
	, m_currentProgram					(DE_NULL)

	, m_arrayBufferBinding				(DE_NULL)
	, m_pixelPackBufferBinding			(DE_NULL)
	, m_pixelUnpackBufferBinding		(DE_NULL)
	, m_transformFeedbackBufferBinding	(DE_NULL)
	, m_uniformBufferBinding			(DE_NULL)
	, m_copyReadBufferBinding			(DE_NULL)
	, m_copyWriteBufferBinding			(DE_NULL)
	, m_drawIndirectBufferBinding		(DE_NULL)

	, m_clearColor						(0.0f, 0.0f, 0.0f, 0.0f)
	, m_clearDepth						(1.0f)
	, m_clearStencil					(0)
	, m_scissorEnabled					(false)
	, m_scissorBox						(m_viewport)
	, m_stencilTestEnabled				(false)
	, m_depthTestEnabled				(false)
	, m_depthFunc						(GL_LESS)
	, m_depthRangeNear					(0.0f)
	, m_depthRangeFar					(1.0f)
	, m_polygonOffsetFactor				(0.0f)
	, m_polygonOffsetUnits				(0.0f)
	, m_polygonOffsetFillEnabled		(false)
	, m_provokingFirstVertexConvention	(false)
	, m_blendEnabled					(false)
	, m_blendModeRGB					(GL_FUNC_ADD)
	, m_blendModeAlpha					(GL_FUNC_ADD)
	, m_blendFactorSrcRGB				(GL_ONE)
	, m_blendFactorDstRGB				(GL_ZERO)
	, m_blendFactorSrcAlpha				(GL_ONE)
	, m_blendFactorDstAlpha				(GL_ZERO)
	, m_blendColor						(0.0f, 0.0f, 0.0f, 0.0f)
	, m_sRGBUpdateEnabled				(true)
	, m_depthClampEnabled				(false)
	, m_colorMask						(true, true, true, true)
	, m_depthMask						(true)
	, m_currentAttribs					(m_limits.maxVertexAttribs, rr::GenericVec4(tcu::Vec4(0, 0, 0, 1)))
	, m_lineWidth						(1.0f)
	, m_primitiveRestartFixedIndex		(false)
	, m_primitiveRestartSettableIndex	(false)
	, m_primitiveRestartIndex			(0)

	, m_lastError						(GL_NO_ERROR)
{
	// Create empty textures to be used when texture objects are incomplete.
	m_emptyTex1D.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex1D.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex1D.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTex1D.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTex1D.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1);
	m_emptyTex1D.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	m_emptyTex1D.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTex2D.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex2D.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex2D.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTex2D.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTex2D.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1);
	m_emptyTex2D.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	m_emptyTex2D.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTexCube.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTexCube.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTexCube.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTexCube.getSampler().magFilter	= tcu::Sampler::NEAREST;
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		m_emptyTexCube.allocFace(0, (tcu::CubeFace)face, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1);
		m_emptyTexCube.getFace(0, (tcu::CubeFace)face).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	}
	m_emptyTexCube.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTex2DArray.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex2DArray.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex2DArray.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTex2DArray.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTex2DArray.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1, 1);
	m_emptyTex2DArray.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	m_emptyTex2DArray.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTex3D.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex3D.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex3D.getSampler().wrapR		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex3D.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTex3D.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTex3D.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1, 1);
	m_emptyTex3D.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	m_emptyTex3D.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTexCubeArray.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTexCubeArray.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTexCubeArray.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTexCubeArray.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTexCubeArray.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1, 6);
	for (int faceNdx = 0; faceNdx < 6; faceNdx++)
		m_emptyTexCubeArray.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0, faceNdx);
	m_emptyTexCubeArray.updateView(tcu::Sampler::MODE_LAST);

	if (glu::isContextTypeGLCore(getType()))
		m_sRGBUpdateEnabled = false;
}